

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::ParseDefineFlag(cmMakefile *this,string *def,bool remove)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  char *pcVar5;
  cmGlobalGenerator *pcVar6;
  long lVar7;
  iterator __first;
  PolicyID id;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_170;
  undefined1 local_160 [8];
  string ndefs;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  const_iterator defBegin;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  const_iterator defEnd;
  string local_108;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defs;
  string local_c8;
  char *local_a8;
  char *cdefs;
  char *define;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  byte local_21;
  string *psStack_20;
  bool remove_local;
  string *def_local;
  cmMakefile *this_local;
  
  local_21 = remove;
  psStack_20 = def;
  def_local = (string *)this;
  if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::valid == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid),
     iVar3 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseDefineFlag::valid,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::valid,&__dso_handle)
    ;
    __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid);
  }
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::find(&ParseDefineFlag::valid,pcVar5);
  if (!bVar1) {
    return false;
  }
  pcVar6 = GetGlobalGenerator(this);
  (*pcVar6->_vptr_cmGlobalGenerator[3])();
  bVar2 = std::operator==(&local_58,"Visual Studio 6");
  bVar1 = false;
  if (bVar2) {
    lVar7 = std::__cxx11::string::find((char *)psStack_20,0x90a6fc);
    bVar1 = false;
    if (lVar7 != -1) {
      lVar7 = std::__cxx11::string::find_first_of((char *)psStack_20,0x8f3cb3);
      bVar1 = lVar7 != -1;
    }
  }
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    return false;
  }
  if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial),
     iVar3 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseDefineFlag::trivial,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::trivial,
                 &__dso_handle);
    __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial);
  }
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::find(&ParseDefineFlag::trivial,pcVar5);
  if (bVar1) goto switchD_004801f2_default;
  PVar4 = GetPolicyStatus(this,CMP0005);
  switch(PVar4) {
  case WARN:
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_78,(cmPolicies *)0x5,id);
    IssueMessage(this,AUTHOR_WARNING,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
  case OLD:
    this_local._7_1_ = false;
    break;
  case NEW:
  default:
switchD_004801f2_default:
    lVar7 = std::__cxx11::string::c_str();
    cdefs = (char *)(lVar7 + 2);
    if ((local_21 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c8,"COMPILE_DEFINITIONS",&local_1c9);
      AppendProperty(this,&local_1c8,cdefs,false);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c8,"COMPILE_DEFINITIONS",
                 (allocator *)
                 ((long)&defs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pcVar5 = GetProperty(this,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&defs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      if (pcVar5 != (char *)0x0) {
        local_a8 = pcVar5;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e8);
        pcVar5 = local_a8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_108,pcVar5,(allocator *)((long)&defEnd._M_current + 7));
        cmSystemTools::ExpandListArgument
                  (&local_108,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e8,false);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator((allocator<char> *)((long)&defEnd._M_current + 7));
        __first = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_e8);
        defBegin._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e8);
        local_120 = std::
                    remove<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char_const*>
                              (__first._M_current,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )defBegin._M_current,&cdefs);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_118,&local_120);
        ndefs.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_e8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_138,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&ndefs.field_2 + 8));
        local_178 = local_138._M_current;
        local_180 = local_118._M_current;
        local_170 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              (local_138,local_118);
        cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ((string *)local_160,&local_170,";");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1a0,"COMPILE_DEFINITIONS",&local_1a1);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        SetProperty(this,&local_1a0,pcVar5);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
        std::__cxx11::string::~string((string *)local_160);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_e8);
      }
    }
    this_local._7_1_ = true;
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&define,(cmPolicies *)0x5,id);
    IssueMessage(this,FATAL_ERROR,(string *)&define,false);
    std::__cxx11::string::~string((string *)&define);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ParseDefineFlag(std::string const& def, bool remove)
{
  // Create a regular expression to match valid definitions.
  static cmsys::RegularExpression
    valid("^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$");

  // Make sure the definition matches.
  if(!valid.find(def.c_str()))
    {
    return false;
    }

  // VS6 IDE does not support definition values with spaces in
  // combination with '"', '$', or ';'.
  if((this->GetGlobalGenerator()->GetName() == "Visual Studio 6") &&
     (def.find(" ") != def.npos && def.find_first_of("\"$;") != def.npos))
    {
    return false;
    }

  // Definitions with non-trivial values require a policy check.
  static cmsys::RegularExpression
    trivial("^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
  if(!trivial.find(def.c_str()))
    {
    // This definition has a non-trivial value.
    switch(this->GetPolicyStatus(cmPolicies::CMP0005))
      {
      case cmPolicies::WARN:
        this->IssueMessage(
          cmake::AUTHOR_WARNING,
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0005)
          );
      case cmPolicies::OLD:
        // OLD behavior is to not escape the value.  We should not
        // convert the definition to use the property.
        return false;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0005)
          );
        return false;
      case cmPolicies::NEW:
        // NEW behavior is to escape the value.  Proceed to convert it
        // to an entry in the property.
        break;
      }
    }

  // Get the definition part after the flag.
  const char* define = def.c_str() + 2;

  if(remove)
    {
    if(const char* cdefs = this->GetProperty("COMPILE_DEFINITIONS"))
      {
      // Expand the list.
      std::vector<std::string> defs;
      cmSystemTools::ExpandListArgument(cdefs, defs);

      // Recompose the list without the definition.
      std::vector<std::string>::const_iterator defEnd =
          std::remove(defs.begin(), defs.end(), define);
      std::vector<std::string>::const_iterator defBegin =
          defs.begin();
      std::string ndefs = cmJoin(cmMakeRange(defBegin, defEnd), ";");

      // Store the new list.
      this->SetProperty("COMPILE_DEFINITIONS", ndefs.c_str());
      }
    }
  else
    {
    // Append the definition to the directory property.
    this->AppendProperty("COMPILE_DEFINITIONS", define);
    }

  return true;
}